

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

clock_updates_list_t * __thiscall
tchecker::clock_updates_visitor_t::clock_updates_of_all_clock_instances
          (clock_updates_list_t *__return_storage_ptr__,clock_updates_visitor_t *this,
          typed_lvalue_expression_t *x)

{
  range_t<unsigned_int,_unsigned_int> rVar1;
  clock_updates_list_t *pcVar2;
  clock_id_t x_00;
  
  rVar1 = extract_lvalue_variable_ids(x);
  x_00 = rVar1._begin;
  if (x_00 != rVar1._end) {
    pcVar2 = clock_updates_map_t::operator[](&this->_u,x_00);
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::vector
              (&__return_storage_ptr__->_list,&pcVar2->_list);
    while (x_00 = x_00 + 1, rVar1._end != x_00) {
      pcVar2 = clock_updates_map_t::operator[](&this->_u,x_00);
      clock_updates_list_t::absorbing_merge(__return_storage_ptr__,pcVar2);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!x_instances.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/statement/static_analysis.cc"
                ,0x2af,
                "tchecker::clock_updates_list_t tchecker::clock_updates_visitor_t::clock_updates_of_all_clock_instances(const tchecker::typed_lvalue_expression_t &) const"
               );
}

Assistant:

tchecker::clock_updates_list_t clock_updates_of_all_clock_instances(tchecker::typed_lvalue_expression_t const & x) const
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    assert(!x_instances.empty());

    tchecker::clock_id_t z = x_instances.begin();
    tchecker::clock_updates_list_t l = _u[z];
    for (++z; z != x_instances.end(); ++z)
      l.absorbing_merge(_u[z]);

    return l;
  }